

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void monster_index_move(chunk *c,wchar_t i1,wchar_t i2)

{
  loc_conflict grid;
  _Bool _Var1;
  monster_conflict *pmVar2;
  monster_conflict *pmVar3;
  object *local_28;
  object *obj;
  monster *mon;
  wchar_t i2_local;
  wchar_t i1_local;
  chunk *c_local;
  
  if ((i1 != i2) &&
     (pmVar2 = cave_monster((chunk_conflict *)c,i1), pmVar2 != (monster_conflict *)0x0)) {
    grid.x = (pmVar2->grid).x;
    grid.y = (pmVar2->grid).y;
    square_set_mon(c,grid,i2);
    pmVar2->midx = i2;
    _Var1 = monster_group_change_index(c,i2,i1);
    if (!_Var1) {
      quit("Bad monster group info!");
      monster_groups_verify(c);
    }
    for (local_28 = pmVar2->held_obj; local_28 != (object *)0x0; local_28 = local_28->next) {
      local_28->held_m_idx = (int16_t)i2;
    }
    if (pmVar2->mimicked_obj != (object *)0x0) {
      pmVar2->mimicked_obj->mimicking_m_idx = (int16_t)i2;
    }
    pmVar3 = (monster_conflict *)target_get_monster();
    if (pmVar3 == pmVar2) {
      pmVar3 = cave_monster((chunk_conflict *)c,i2);
      target_set_monster((monster *)pmVar3);
    }
    if ((monster_conflict *)player->upkeep->health_who == pmVar2) {
      pmVar2 = cave_monster((chunk_conflict *)c,i2);
      player->upkeep->health_who = (monster *)pmVar2;
    }
    pmVar2 = cave_monster((chunk_conflict *)c,i2);
    pmVar3 = cave_monster((chunk_conflict *)c,i1);
    memcpy(pmVar2,pmVar3,0x1f0);
    pmVar2 = cave_monster((chunk_conflict *)c,i1);
    memset(pmVar2,0,0x1f0);
  }
  return;
}

Assistant:

void monster_index_move(struct chunk *c, int i1, int i2)
{
	struct monster *mon;
	struct object *obj;

	/* Do nothing */
	if (i1 == i2) return;

	/* Old monster */
	mon = cave_monster(c, i1);
	if (!mon) return;

	/* Update the cave */
	square_set_mon(c, mon->grid, i2);

	/* Update midx */
	mon->midx = i2;

	/* Update group */
	if (!monster_group_change_index(c, i2, i1)) {
		quit("Bad monster group info!") ;
		monster_groups_verify(c);
	}

	/* Repair objects being carried by monster */
	for (obj = mon->held_obj; obj; obj = obj->next)
		obj->held_m_idx = i2;

	/* Move mimicked objects (heh) */
	if (mon->mimicked_obj)
		mon->mimicked_obj->mimicking_m_idx = i2;

	/* Update the target */
	if (target_get_monster() == mon)
		target_set_monster(cave_monster(c, i2));

	/* Update the health bar */
	if (player->upkeep->health_who == mon)
		player->upkeep->health_who = cave_monster(c, i2);

	/* Move monster */
	memcpy(cave_monster(c, i2),
			cave_monster(c, i1),
			sizeof(struct monster));

	/* Wipe hole */
	memset(cave_monster(c, i1), 0, sizeof(struct monster));
}